

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

int __thiscall position::see(position *this,Move *m)

{
  int iVar1;
  bool bVar2;
  Piece PVar3;
  reference pvVar4;
  value_type local_60;
  value_type local_5c;
  value_type local_58;
  Square local_3c;
  int local_38;
  int local_34;
  int tval;
  int fval;
  Square local_28;
  Square local_24;
  Move *local_20;
  Move *m_local;
  position *this_local;
  
  if (m->type == '\f') {
    this_local._4_4_ = 0;
  }
  else {
    bVar2 = false;
    local_20 = m;
    m_local = (Move *)this;
    if (m->type == '\v') {
      local_24 = (Square)m->f;
      PVar3 = piece_on(this,&local_24);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar3);
      iVar1 = *pvVar4;
      local_28 = (Square)local_20->t;
      PVar3 = piece_on(this,&local_28);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar3);
      bVar2 = iVar1 <= *pvVar4;
    }
    if (bVar2) {
      fval = (int)local_20->t;
      PVar3 = piece_on(this,(Square *)&fval);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar3);
      iVar1 = *pvVar4;
      tval = (int)local_20->f;
      PVar3 = piece_on(this,(Square *)&tval);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar3);
      this_local._4_4_ = iVar1 - *pvVar4;
    }
    else {
      if ((((local_20->type == '\x04') || (local_20->type == '\x05')) || (local_20->type == '\x06'))
         || (local_20->type == '\a')) {
        if (local_20->type == '\x04') {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,4);
          local_58 = *pvVar4;
        }
        else {
          if (local_20->type == '\x05') {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,3);
            local_5c = *pvVar4;
          }
          else {
            if (local_20->type == '\x06') {
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,2);
              local_60 = *pvVar4;
            }
            else {
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,1);
              local_60 = *pvVar4;
            }
            local_5c = local_60;
          }
          local_58 = local_5c;
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,0);
        local_34 = local_58 - *pvVar4;
        local_3c = (Square)local_20->t;
        PVar3 = piece_on(this,&local_3c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar3);
        local_38 = *pvVar4;
        if (local_34 <= local_38) {
          return local_34 - local_38;
        }
      }
      this_local._4_4_ = see_move(this,local_20);
    }
  }
  return this_local._4_4_;
}

Assistant:

int position::see(const Move& m) const {

	if (m.type == Movetype::ep) return 0;

	else if (m.type == Movetype::capture &&
		(mvals[piece_on(Square(m.f))] <= mvals[piece_on(Square(m.t))])) {
		return (mvals[piece_on(Square(m.t))] - mvals[piece_on(Square(m.f))]);
	}

	else if (m.type == Movetype::capture_promotion_q ||
		m.type == Movetype::capture_promotion_r ||
		m.type == Movetype::capture_promotion_b ||
		m.type == Movetype::capture_promotion_n) {
		int fval = (m.type == Movetype::capture_promotion_q ? mvals[queen] :
			m.type == Movetype::capture_promotion_r ? mvals[rook] :
			m.type == Movetype::capture_promotion_b ? mvals[bishop] :
			mvals[knight]) - mvals[0];
		int tval = mvals[piece_on(Square(m.t))];

		if (fval <= tval) return fval - tval;
	}


	return see_move(m);
}